

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Maybe<kj::Promise<void>_> __thiscall
kj::anon_unknown_36::HttpClientAdapter::DelayedCloseWebSocket::tryPumpFrom
          (DelayedCloseWebSocket *this,WebSocket *other)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  void *pvVar3;
  long *in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar4;
  TransformPromiseNodeBase *this_00;
  Maybe<kj::Promise<void>_> MVar5;
  OwnPromiseNode local_58;
  OwnPromiseNode local_50;
  Disposer *local_48;
  undefined1 local_40 [24];
  
  (**(code **)(*in_RDX + 0x38))(&local_58);
  OVar2.ptr = local_58.ptr;
  pPVar1 = ((local_58.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_58.ptr - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_58,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6981:40)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_0061cc78;
    *(WebSocket **)((long)pvVar3 + 0x3f8) = other;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    ((local_58.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&local_58.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_58,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6981:40)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0061cc78;
    OVar2.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)other;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_40._0_8_ = &DAT_0048a171;
  local_40._8_8_ = &DAT_0048a1d0;
  local_40._16_8_ = &DAT_4c0000058b;
  local_50.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_48,&local_50,(SourceLocation *)local_40);
  OVar2.ptr = local_50.ptr;
  aVar4 = extraout_RDX;
  if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
    local_50.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    aVar4 = extraout_RDX_00;
  }
  OVar2.ptr = local_58.ptr;
  *(undefined1 *)&(this->super_WebSocket)._vptr_WebSocket = 1;
  (this->inner).disposer = local_48;
  if (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    aVar4 = extraout_RDX_01;
  }
  MVar5.ptr.field_1 = aVar4;
  MVar5.ptr._0_8_ = this;
  return (Maybe<kj::Promise<void>_>)MVar5.ptr;
}

Assistant:

kj::Maybe<kj::Promise<void>> tryPumpFrom(WebSocket& other) override {
      return other.pumpTo(*inner).then([this]() {
        return afterSendClosed();
      });
    }